

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall wallet::SQLiteBatch::ReadKey(SQLiteBatch *this,DataStream *key,DataStream *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  wallet *this_00;
  pointer pbVar2;
  size_type sVar3;
  sqlite3_stmt *psVar4;
  string_view source_file;
  bool bVar5;
  int iVar6;
  Logger *pLVar7;
  long lVar8;
  string *in_R9;
  pointer pbVar9;
  long in_FS_OFFSET;
  string_view str;
  Span<const_std::byte> blob;
  string_view logging_function;
  string log_msg;
  char local_e8 [14] [8];
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    this_00 = (wallet *)this->m_read_stmt;
    if (this_00 == (wallet *)0x0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1cc,"virtual bool wallet::SQLiteBatch::ReadKey(DataStream &&, DataStream &)")
      ;
    }
    pbVar9 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    pbVar2 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    sVar3 = key->m_read_pos;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"key","");
    pbVar9 = pbVar9 + sVar3;
    args_1 = &local_58;
    blob.m_size = (size_t)args_1;
    blob.m_data = pbVar2 + -(long)pbVar9;
    bVar5 = BindBlobToStatement(this_00,(sqlite3_stmt *)0x1,(int)pbVar9,blob,in_R9);
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (bVar5) {
      iVar6 = sqlite3_step(this->m_read_stmt);
      if (iVar6 == 100) {
        pbVar9 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish != pbVar9) {
          (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = pbVar9;
        }
        value->m_read_pos = 0;
        psVar4 = this->m_read_stmt;
        lVar8 = sqlite3_column_blob(psVar4,0);
        iVar6 = sqlite3_column_bytes(psVar4,0);
        std::vector<std::byte,zero_after_free_allocator<std::byte>>::
        _M_range_insert<std::byte_const*>
                  ((vector<std::byte,zero_after_free_allocator<std::byte>> *)value,
                   (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                   ._M_impl.super__Vector_impl_data._M_finish,lVar8,iVar6 + lVar8);
        bVar5 = true;
      }
      else {
        if (iVar6 != 0x65) {
          local_e8[0] = (char  [8])sqlite3_errstr(iVar6);
          pLVar7 = LogInstance();
          bVar5 = BCLog::Logger::Enabled(pLVar7);
          if (bVar5) {
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)paVar1;
            tinyformat::format<char[8],char_const*>
                      (&local_78,(tinyformat *)"%s: Unable to execute statement: %s\n","ReadKey",
                       local_e8,(char **)args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_58,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            pLVar7 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x5a;
            local_78._M_string_length = 0x8719b8;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
            ;
            source_file._M_len = 0x5a;
            str._M_str = local_58._M_dataplus._M_p;
            str._M_len = local_58._M_string_length;
            logging_function._M_str = "ReadKey";
            logging_function._M_len = 7;
            BCLog::Logger::LogPrintStr(pLVar7,str,logging_function,source_file,0x1d4,ALL,Info);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != paVar1) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        bVar5 = false;
      }
      sqlite3_clear_bindings(this->m_read_stmt);
      sqlite3_reset(this->m_read_stmt);
      goto LAB_005807e6;
    }
  }
  bVar5 = false;
LAB_005807e6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    if (res != SQLITE_ROW) {
        if (res != SQLITE_DONE) {
            // SQLITE_DONE means "not found", don't log an error in that case.
            LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
        }
        sqlite3_clear_bindings(m_read_stmt);
        sqlite3_reset(m_read_stmt);
        return false;
    }
    // Leftmost column in result is index 0
    value.clear();
    value.write(SpanFromBlob(m_read_stmt, 0));

    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return true;
}